

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void swap_nifti_header(nifti_1_header *h,int is_nifti)

{
  int is_nifti_local;
  nifti_1_header *h_local;
  
  if (is_nifti == 0) {
    nifti_swap_as_analyze((nifti_analyze75 *)h);
  }
  else {
    nifti_swap_4bytes(1,h);
    nifti_swap_4bytes(1,&h->extents);
    nifti_swap_2bytes(1,&h->session_error);
    nifti_swap_2bytes(8,h->dim);
    nifti_swap_4bytes(1,&h->intent_p1);
    nifti_swap_4bytes(1,&h->intent_p2);
    nifti_swap_4bytes(1,&h->intent_p3);
    nifti_swap_2bytes(1,&h->intent_code);
    nifti_swap_2bytes(1,&h->datatype);
    nifti_swap_2bytes(1,&h->bitpix);
    nifti_swap_2bytes(1,&h->slice_start);
    nifti_swap_4bytes(8,h->pixdim);
    nifti_swap_4bytes(1,&h->vox_offset);
    nifti_swap_4bytes(1,&h->scl_slope);
    nifti_swap_4bytes(1,&h->scl_inter);
    nifti_swap_2bytes(1,&h->slice_end);
    nifti_swap_4bytes(1,&h->cal_max);
    nifti_swap_4bytes(1,&h->cal_min);
    nifti_swap_4bytes(1,&h->slice_duration);
    nifti_swap_4bytes(1,&h->toffset);
    nifti_swap_4bytes(1,&h->glmax);
    nifti_swap_4bytes(1,&h->glmin);
    nifti_swap_2bytes(1,&h->qform_code);
    nifti_swap_2bytes(1,&h->sform_code);
    nifti_swap_4bytes(1,&h->quatern_b);
    nifti_swap_4bytes(1,&h->quatern_c);
    nifti_swap_4bytes(1,&h->quatern_d);
    nifti_swap_4bytes(1,&h->qoffset_x);
    nifti_swap_4bytes(1,&h->qoffset_y);
    nifti_swap_4bytes(1,&h->qoffset_z);
    nifti_swap_4bytes(4,h->srow_x);
    nifti_swap_4bytes(4,h->srow_y);
    nifti_swap_4bytes(4,h->srow_z);
  }
  return;
}

Assistant:

void swap_nifti_header( struct nifti_1_header *h , int is_nifti )
{

   /* if ANALYZE, swap as such and return */
   if( ! is_nifti ) {
      nifti_swap_as_analyze((nifti_analyze75 *)h);
      return;
   }

   /* otherwise, swap all NIFTI fields */

   nifti_swap_4bytes(1, &h->sizeof_hdr);
   nifti_swap_4bytes(1, &h->extents);
   nifti_swap_2bytes(1, &h->session_error);

   nifti_swap_2bytes(8, h->dim);
   nifti_swap_4bytes(1, &h->intent_p1);
   nifti_swap_4bytes(1, &h->intent_p2);
   nifti_swap_4bytes(1, &h->intent_p3);

   nifti_swap_2bytes(1, &h->intent_code);
   nifti_swap_2bytes(1, &h->datatype);
   nifti_swap_2bytes(1, &h->bitpix);
   nifti_swap_2bytes(1, &h->slice_start);

   nifti_swap_4bytes(8, h->pixdim);

   nifti_swap_4bytes(1, &h->vox_offset);
   nifti_swap_4bytes(1, &h->scl_slope);
   nifti_swap_4bytes(1, &h->scl_inter);
   nifti_swap_2bytes(1, &h->slice_end);

   nifti_swap_4bytes(1, &h->cal_max);
   nifti_swap_4bytes(1, &h->cal_min);
   nifti_swap_4bytes(1, &h->slice_duration);
   nifti_swap_4bytes(1, &h->toffset);
   nifti_swap_4bytes(1, &h->glmax);
   nifti_swap_4bytes(1, &h->glmin);

   nifti_swap_2bytes(1, &h->qform_code);
   nifti_swap_2bytes(1, &h->sform_code);

   nifti_swap_4bytes(1, &h->quatern_b);
   nifti_swap_4bytes(1, &h->quatern_c);
   nifti_swap_4bytes(1, &h->quatern_d);
   nifti_swap_4bytes(1, &h->qoffset_x);
   nifti_swap_4bytes(1, &h->qoffset_y);
   nifti_swap_4bytes(1, &h->qoffset_z);

   nifti_swap_4bytes(4, h->srow_x);
   nifti_swap_4bytes(4, h->srow_y);
   nifti_swap_4bytes(4, h->srow_z);

   return ;
}